

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O2

void __thiscall UDUNITS_derivedAlias_Test::TestBody(UDUNITS_derivedAlias_Test *this)

{
  double dVar1;
  XMLError XVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  uint64_t uVar6;
  XMLElement *this_00;
  unit uVar7;
  XMLElement *pXVar8;
  ostream *poVar9;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *in_R9;
  precise_unit pVar10;
  unit local_3e8;
  int failConvert;
  AssertionResult gtest_ar_;
  string def;
  string local_398;
  string local_378;
  string local_358;
  XMLDocument doc;
  
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  XVar2 = tinyxml2::XMLDocument::LoadFile
                    (&doc,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-derived.xml"
                    );
  this_01 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = XVar2 == XML_SUCCESS;
  if (XVar2 == XML_SUCCESS) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_01);
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"unit-system");
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"unit");
    failConvert = 0;
    while (pXVar3 != (XMLElement *)0x0) {
      pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"def");
      if (pXVar4 == (XMLElement *)0x0) {
        std::__cxx11::string::string((string *)&def,"rad",(allocator *)&gtest_ar_);
      }
      else {
        pcVar5 = tinyxml2::XMLNode::Value((pXVar4->super_XMLNode)._firstChild);
        std::__cxx11::string::string((string *)&def,pcVar5,(allocator *)&gtest_ar_);
      }
      std::__cxx11::string::string((string *)&local_378,(string *)&def);
      uVar6 = units::getDefaultFlags();
      pVar10 = units::unit_from_string(&local_378,uVar6);
      std::__cxx11::string::~string((string *)&local_378);
      pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"aliases");
      if (pXVar4 == (XMLElement *)0x0) {
        pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"unit");
      }
      else {
        this_00 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"name");
        uVar7 = (unit)((ulong)(uint)(float)pVar10.multiplier_ | pVar10._8_8_ << 0x20);
        for (; this_00 != (XMLElement *)0x0;
            this_00 = tinyxml2::XMLNode::NextSiblingElement(&this_00->super_XMLNode,"name")) {
          pXVar8 = tinyxml2::XMLNode::FirstChildElement(&this_00->super_XMLNode,"singular");
          pcVar5 = tinyxml2::XMLNode::Value((pXVar8->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)&local_358,pcVar5,(allocator *)&gtest_ar_);
          uVar6 = units::getDefaultFlags();
          pVar10 = units::unit_from_string(&local_358,uVar6);
          std::__cxx11::string::~string((string *)&local_358);
          if ((pVar10._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar10.multiplier_)) {
            poVar9 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar9 = std::operator<<(poVar9,pcVar5);
            poVar9 = std::operator<<(poVar9," into a valid unit def=");
            poVar9 = std::operator<<(poVar9,(string *)&def);
            std::operator<<(poVar9,'\n');
LAB_001296cf:
            failConvert = failConvert + 1;
          }
          else {
            gtest_ar_._0_8_ = (ulong)(uint)(float)pVar10.multiplier_ | pVar10._8_8_ << 0x20;
            local_3e8 = uVar7;
            dVar1 = units::convert<units::unit,units::unit>((unit *)&gtest_ar_,&local_3e8);
            if ((dVar1 != 1.0) || (NAN(dVar1))) {
              poVar9 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
              poVar9 = std::operator<<(poVar9,pcVar5);
              poVar9 = std::operator<<(poVar9," and ");
              poVar9 = std::operator<<(poVar9,(string *)&def);
              std::operator<<(poVar9,"\n");
              goto LAB_001296cf;
            }
          }
        }
        for (pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"symbol");
            pXVar4 != (XMLElement *)0x0;
            pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"symbol")) {
          pcVar5 = tinyxml2::XMLNode::Value((pXVar4->super_XMLNode)._firstChild);
          std::__cxx11::string::string((string *)&local_398,pcVar5,(allocator *)&gtest_ar_);
          uVar6 = units::getDefaultFlags();
          pVar10 = units::unit_from_string(&local_398,uVar6);
          std::__cxx11::string::~string((string *)&local_398);
          if ((pVar10._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar10.multiplier_)) {
            poVar9 = std::operator<<((ostream *)&std::cout,"unable to convert ");
            poVar9 = std::operator<<(poVar9,pcVar5);
            poVar9 = std::operator<<(poVar9," into a valid unit def=");
            poVar9 = std::operator<<(poVar9,(string *)&def);
            std::operator<<(poVar9,'\n');
LAB_0012983a:
            failConvert = failConvert + 1;
          }
          else {
            gtest_ar_._0_8_ = (ulong)(uint)(float)pVar10.multiplier_ | pVar10._8_8_ << 0x20;
            local_3e8 = uVar7;
            dVar1 = units::convert<units::unit,units::unit>((unit *)&gtest_ar_,&local_3e8);
            if ((dVar1 != 1.0) || (NAN(dVar1))) {
              poVar9 = std::operator<<((ostream *)&std::cout,"name and unit do not match ");
              poVar9 = std::operator<<(poVar9,pcVar5);
              poVar9 = std::operator<<(poVar9," and ");
              poVar9 = std::operator<<(poVar9,(string *)&def);
              std::operator<<(poVar9,"\n");
              goto LAB_0012983a;
            }
          }
        }
        pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"unit");
      }
      std::__cxx11::string::~string((string *)&def);
    }
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&def,"failConvert","0",&failConvert,(int *)&gtest_ar_);
    if ((char)def._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (def._M_string_length == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)def._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x105,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3e8,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e8);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&def._M_string_length;
  }
  else {
    testing::Message::Message((Message *)&local_3e8);
    std::ostream::operator<<((long *)((long)local_3e8 + 0x10),XVar2);
    std::endl<char,std::char_traits<char>>((ostream *)((long)local_3e8 + 0x10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&def,(internal *)&gtest_ar_,(AssertionResult *)0x169878,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&failConvert,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0xcb,(char *)CONCAT71(def._M_dataplus._M_p._1_7_,(char)def._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&failConvert,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&failConvert);
    std::__cxx11::string::~string((string *)&def);
    if (local_3e8 != (unit)0x0) {
      (**(code **)(*(long *)local_3e8 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  tinyxml2::XMLDocument::~XMLDocument(&doc);
  return;
}

Assistant:

TEST(UDUNITS, derivedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-derived.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        auto defEl = cs->FirstChildElement("def");
        // the only one without a definition is the radian since it is
        // dimensionless according to the xml
        std::string def =
            (defEl) ? defEl->FirstChild()->Value() : std::string("rad");

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (alias == nullptr) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(nameUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << sname
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(symUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << symString
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}